

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O2

void transaction_tests::CreateCreditAndSpend
               (FillableSigningProvider *keystore,CScript *outscript,CTransactionRef *output,
               CMutableTransaction *input,bool success)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  element_type *peVar3;
  CTxIn *pCVar4;
  CTxOut *pCVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  long in_FS_OFFSET;
  ParamsWrapper<TransactionSerParams,_CMutableTransaction> local_498;
  DataStream ssin;
  CMutableTransaction inputm;
  DataStream ssout;
  CMutableTransaction outputm;
  SignatureData empty;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&outputm);
  outputm.version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&outputm.vin,1);
  COutPoint::SetNull(&(outputm.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start)->prevout);
  empty.scriptSig.super_CScriptBase._union._8_8_ = 0;
  empty.scriptSig.super_CScriptBase._union._16_8_ = 0;
  empty.complete = false;
  empty.witness = false;
  empty._2_6_ = 0;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((outputm.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&outputm.vout,1);
  (outputm.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 1;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((outputm.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             &outscript->super_CScriptBase);
  ssout.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ssout.m_read_pos = 0;
  ssout.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ssout.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty._0_8_ = &::TX_WITH_WITNESS;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)&outputm;
  ParamsWrapper<TransactionSerParams,_CMutableTransaction>::Serialize<DataStream>
            ((ParamsWrapper<TransactionSerParams,_CMutableTransaction> *)&empty,&ssout);
  empty._0_8_ = &::TX_WITH_WITNESS;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)output;
  ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_>::Unserialize<DataStream>
            ((ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> *)&empty,
             &ssout);
  peVar3 = (output->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar4 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pCVar4 != 0x68) {
    __assert_fail("output->vin.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1d0,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  bVar9 = ::operator==(pCVar4,outputm.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_start);
  if (!bVar9) {
    __assert_fail("output->vin[0] == outputm.vin[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1d1,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  peVar3 = (output->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar5 = (peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(peVar3->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pCVar5 != 0x28) {
    __assert_fail("output->vout.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1d2,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  bVar9 = ::operator==(pCVar5,outputm.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  if (!bVar9) {
    __assert_fail("output->vout[0] == outputm.vout[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1d3,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  CMutableTransaction::CMutableTransaction(&inputm);
  inputm.version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&inputm.vin,1);
  peVar3 = (output->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar6 = *(undefined8 *)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar7 = *(undefined8 *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar8 = *(undefined8 *)
           ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)
   (((inputm.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)
   (((inputm.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar8;
  *(undefined8 *)
   ((inputm.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar6;
  *(undefined8 *)
   (((inputm.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
     _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar7;
  ((inputm.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&inputm.vout,1);
  (inputm.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 1;
  empty.scriptSig.super_CScriptBase._union._8_8_ = 0;
  empty.scriptSig.super_CScriptBase._union._16_8_ = 0;
  empty.complete = false;
  empty.witness = false;
  empty._2_6_ = 0;
  empty.scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((inputm.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&empty);
  empty._0_8_ = empty._0_8_ & 0xffffffffffff0000;
  p_Var1 = &empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header;
  empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  memset(&empty.scriptSig,0,0xb8);
  empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  empty.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  empty.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  empty.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  empty.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  empty.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  empty.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  empty.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       empty.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar9 = SignSignature(&keystore->super_SigningProvider,
                        (output->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                        ._M_ptr,&inputm,0,1,&empty);
  if (bVar9 != success) {
    __assert_fail("ret == success",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1df,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  ssin.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ssin.m_read_pos = 0;
  ssin.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ssin.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498.m_params = &::TX_WITH_WITNESS;
  local_498.m_object = &inputm;
  ParamsWrapper<TransactionSerParams,_CMutableTransaction>::Serialize<DataStream>(&local_498,&ssin);
  local_498.m_params = &::TX_WITH_WITNESS;
  local_498.m_object = input;
  ParamsWrapper<TransactionSerParams,_CMutableTransaction>::Unserialize<DataStream>
            (&local_498,&ssin);
  pCVar4 = (input->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(input->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pCVar4 != 0x68) {
    __assert_fail("input.vin.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1e3,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  bVar9 = ::operator==(pCVar4,inputm.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_start);
  if (!bVar9) {
    __assert_fail("input.vin[0] == inputm.vin[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1e4,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  pCVar5 = (input->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(input->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pCVar5 == 0x28) {
    bVar9 = ::operator==(pCVar5,inputm.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    if (!bVar9) {
      __assert_fail("input.vout[0] == inputm.vout[0]",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                    ,0x1e6,
                    "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                   );
    }
    bVar9 = std::operator==(&(((input->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start)->scriptWitness).stack,
                            &((inputm.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_start)->scriptWitness).stack);
    if (bVar9) {
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ssin);
      SignatureData::~SignatureData(&empty);
      CMutableTransaction::~CMutableTransaction(&inputm);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ssout);
      CMutableTransaction::~CMutableTransaction(&outputm);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
      __stack_chk_fail();
    }
    __assert_fail("input.vin[0].scriptWitness.stack == inputm.vin[0].scriptWitness.stack",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x1e7,
                  "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
                 );
  }
  __assert_fail("input.vout.size() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                ,0x1e5,
                "void transaction_tests::CreateCreditAndSpend(const FillableSigningProvider &, const CScript &, CTransactionRef &, CMutableTransaction &, bool)"
               );
}

Assistant:

static void CreateCreditAndSpend(const FillableSigningProvider& keystore, const CScript& outscript, CTransactionRef& output, CMutableTransaction& input, bool success = true)
{
    CMutableTransaction outputm;
    outputm.version = 1;
    outputm.vin.resize(1);
    outputm.vin[0].prevout.SetNull();
    outputm.vin[0].scriptSig = CScript();
    outputm.vout.resize(1);
    outputm.vout[0].nValue = 1;
    outputm.vout[0].scriptPubKey = outscript;
    DataStream ssout;
    ssout << TX_WITH_WITNESS(outputm);
    ssout >> TX_WITH_WITNESS(output);
    assert(output->vin.size() == 1);
    assert(output->vin[0] == outputm.vin[0]);
    assert(output->vout.size() == 1);
    assert(output->vout[0] == outputm.vout[0]);

    CMutableTransaction inputm;
    inputm.version = 1;
    inputm.vin.resize(1);
    inputm.vin[0].prevout.hash = output->GetHash();
    inputm.vin[0].prevout.n = 0;
    inputm.vout.resize(1);
    inputm.vout[0].nValue = 1;
    inputm.vout[0].scriptPubKey = CScript();
    SignatureData empty;
    bool ret = SignSignature(keystore, *output, inputm, 0, SIGHASH_ALL, empty);
    assert(ret == success);
    DataStream ssin;
    ssin << TX_WITH_WITNESS(inputm);
    ssin >> TX_WITH_WITNESS(input);
    assert(input.vin.size() == 1);
    assert(input.vin[0] == inputm.vin[0]);
    assert(input.vout.size() == 1);
    assert(input.vout[0] == inputm.vout[0]);
    assert(input.vin[0].scriptWitness.stack == inputm.vin[0].scriptWitness.stack);
}